

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_token_tree.cpp
# Opt level: O0

idx_t __thiscall
duckdb::WindowTokenTree::PeerEnd(WindowTokenTree *this,idx_t lower,idx_t upper,idx_t row_idx)

{
  bool bVar1;
  idx_t in_RCX;
  idx_t in_RDX;
  idx_t in_RSI;
  MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *in_RDI;
  MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *tree;
  undefined8 local_8;
  
  tree = in_RDI;
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
                      *)0x1a41e8e);
  if (bVar1) {
    unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
    ::operator*((unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
                 *)in_RDI);
    local_8 = NextPeer<duckdb::MergeSortTree<unsigned_long,unsigned_long,std::less<unsigned_long>,32ul,32ul>>
                        ((MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>
                          *)tree,in_RSI,in_RDX,in_RCX);
  }
  else {
    unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
    ::operator*((unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
                 *)in_RDI);
    local_8 = NextPeer<duckdb::MergeSortTree<unsigned_int,unsigned_int,std::less<unsigned_int>,32ul,32ul>>
                        (tree,in_RSI,in_RDX,in_RCX);
  }
  return local_8;
}

Assistant:

idx_t WindowTokenTree::PeerEnd(const idx_t lower, const idx_t upper, const idx_t row_idx) const {
	if (mst64) {
		return NextPeer(*mst64, lower, upper, row_idx);
	} else {
		return NextPeer(*mst32, lower, upper, row_idx);
	}
}